

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

CBData * __thiscall asmjit::CodeBuilder::newDataNode(CodeBuilder *this,void *data,uint32_t size)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  Error EVar3;
  int iVar4;
  Error extraout_EAX;
  CBData *pCVar5;
  CodeBuilder *__dest;
  size_t sVar6;
  undefined4 extraout_var;
  CBLabel *node;
  ushort uVar8;
  size_t extraout_RDX;
  ulong __n;
  CodeBuilder *pCVar9;
  CodeBuilder *pCVar10;
  CodeBuilder *this_00;
  CodeBuilder *pCVar11;
  CBNode *pCVar12;
  size_t unaff_R13;
  size_t sStack_a0;
  CodeBuilder *pCStack_98;
  CodeBuilder *pCStack_90;
  CodeBuilder *pCStack_88;
  CodeBuilder *pCStack_80;
  size_t sStack_78;
  ulong uStack_70;
  code *pcStack_68;
  size_t sStack_58;
  ulong uStack_50;
  void *pvStack_48;
  CodeBuilder *pCStack_40;
  size_t local_30;
  CodeBuilder *pCVar7;
  
  __n = (ulong)size;
  this_00 = this;
  if (size < 0x15) goto LAB_0011226e;
  this_00 = (CodeBuilder *)&this->_cbDataZone;
  unaff_R13 = (size_t)size;
  __dest = (CodeBuilder *)(this->_cbDataZone)._ptr;
  puVar2 = (this->_cbDataZone)._end;
  if ((ulong)((long)puVar2 - (long)__dest) < unaff_R13) goto LAB_00112303;
  puVar1 = (uint8_t *)((long)&(__dest->super_CodeEmitter)._vptr_CodeEmitter + unaff_R13);
  ((Zone *)this_00)->_ptr = puVar1;
  pCVar9 = (CodeBuilder *)data;
  if (puVar1 <= puVar2) {
    while( true ) {
      data = pCVar9;
      if ((__dest != (CodeBuilder *)0x0) && (data = __dest, pCVar9 != (CodeBuilder *)0x0)) {
        pCStack_40 = (CodeBuilder *)0x11225a;
        this_00 = __dest;
        memcpy(__dest,pCVar9,unaff_R13);
      }
      if (__dest == (CodeBuilder *)0x0) break;
LAB_0011226e:
      if ((this->_cbHeap)._zone != (Zone *)0x0) {
        pCStack_40 = (CodeBuilder *)0x112292;
        pCVar5 = (CBData *)ZoneHeap::_alloc(&this->_cbHeap,0x40,&local_30);
        (pCVar5->super_CBNode)._prev = (CBNode *)0x0;
        (pCVar5->super_CBNode)._next = (CBNode *)0x0;
        (pCVar5->super_CBNode)._type = '\x02';
        (pCVar5->super_CBNode)._opCount = '\0';
        (pCVar5->super_CBNode)._flags = (uint16_t)this->_nodeFlags;
        (pCVar5->super_CBNode)._position = this->_position;
        (pCVar5->super_CBNode)._inlineComment = (char *)0x0;
        (pCVar5->super_CBNode)._passData = (void *)0x0;
        if (size < 0x15) {
          if ((CodeBuilder *)data != (CodeBuilder *)0x0) {
            pCStack_40 = (CodeBuilder *)0x1122dc;
            memcpy(&pCVar5->field_0,data,__n);
          }
        }
        else {
          *(void **)&pCVar5->field_0 = data;
        }
        (pCVar5->field_0).field_0._size = size;
        return pCVar5;
      }
      pCStack_40 = (CodeBuilder *)0x112303;
      newDataNode();
LAB_00112303:
      pCStack_40 = (CodeBuilder *)0x11230b;
      __dest = (CodeBuilder *)Zone::_alloc((Zone *)this_00,unaff_R13);
      pCVar9 = (CodeBuilder *)data;
    }
    return (CBData *)0x0;
  }
  pCStack_40 = (CodeBuilder *)newConstPool;
  newDataNode();
  uStack_50 = __n;
  pvStack_48 = data;
  pCStack_40 = this;
  if ((this_00->_cbHeap)._zone != (Zone *)0x0) {
    pcStack_68 = (code *)0x112348;
    pCVar5 = (CBData *)ZoneHeap::_alloc(&this_00->_cbHeap,0x118,&sStack_58);
    (pCVar5->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar5->super_CBNode)._next = (CBNode *)0x0;
    (pCVar5->super_CBNode)._type = '\x04';
    (pCVar5->super_CBNode)._opCount = '\0';
    (pCVar5->super_CBNode)._flags = (uint16_t)this_00->_nodeFlags;
    (pCVar5->super_CBNode)._position = this_00->_position;
    (pCVar5->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar5->super_CBNode)._passData = (void *)0x0;
    (pCVar5->field_0).field_1._externalPtr = (uint8_t *)0xffffffff;
    *(CBJump **)((long)&pCVar5->field_0 + 8) = (CBJump *)0x0;
    pcStack_68 = (code *)0x112392;
    ConstPool::ConstPool((ConstPool *)((long)&pCVar5->field_0 + 0x10),&this_00->_cbBaseZone);
    (pCVar5->super_CBNode)._type = '\x06';
    pcStack_68 = (code *)0x1123a2;
    EVar3 = registerLabelNode(this_00,(CBLabel *)pCVar5);
    if (EVar3 != 0) {
      pCVar5 = (CBData *)0x0;
    }
    return pCVar5;
  }
  pcStack_68 = newCommentNode;
  newConstPool();
  pCVar10 = pCVar9;
  pCVar11 = this_00;
  uStack_70 = __n;
  pcStack_68 = (code *)data;
  if (pCVar9 == (CodeBuilder *)0x0) {
    pCVar7 = (CodeBuilder *)0x0;
  }
  else {
    sVar6 = extraout_RDX;
    if (extraout_RDX == 0xffffffffffffffff) {
      pCStack_80 = (CodeBuilder *)0x1123d7;
      pCVar11 = pCVar9;
      sVar6 = strlen((char *)pCVar9);
    }
    pCVar7 = pCVar9;
    if (sVar6 != 0) {
      pCVar11 = (CodeBuilder *)&this_00->_cbDataZone;
      pCStack_80 = (CodeBuilder *)0x1123f3;
      iVar4 = Zone::dup((Zone *)pCVar11,(int)pCVar9);
      pCVar7 = (CodeBuilder *)CONCAT44(extraout_var,iVar4);
      pCVar10 = pCVar9;
      if (pCVar7 == (CodeBuilder *)0x0) {
        return (CBData *)0x0;
      }
    }
  }
  if ((this_00->_cbHeap)._zone != (Zone *)0x0) {
    pCStack_80 = (CodeBuilder *)0x11241f;
    pCVar5 = (CBData *)ZoneHeap::_alloc(&this_00->_cbHeap,0x28,&sStack_78);
    (pCVar5->super_CBNode)._prev = (CBNode *)0x0;
    (pCVar5->super_CBNode)._next = (CBNode *)0x0;
    (pCVar5->super_CBNode)._type = '\a';
    (pCVar5->super_CBNode)._opCount = '\0';
    uVar8 = (ushort)this_00->_nodeFlags;
    (pCVar5->super_CBNode)._flags = uVar8;
    (pCVar5->super_CBNode)._position = this_00->_position;
    (pCVar5->super_CBNode)._inlineComment = (char *)0x0;
    (pCVar5->super_CBNode)._passData = (void *)0x0;
    (pCVar5->super_CBNode)._flags = uVar8 | 0xc;
    (pCVar5->super_CBNode)._inlineComment = (char *)pCVar7;
    return pCVar5;
  }
  pCStack_80 = (CodeBuilder *)newLabel;
  newCommentNode();
  pCVar12 = (CBNode *)0xffffffff00000004;
  if ((pCVar10->super_CodeEmitter)._lastError == 0) {
    pCStack_98 = pCVar7;
    pCStack_90 = __dest;
    pCStack_88 = this_00;
    pCStack_80 = this;
    if ((pCVar10->_cbHeap)._zone == (Zone *)0x0) {
      newLabel();
      EVar3 = extraout_EAX;
    }
    else {
      node = (CBLabel *)ZoneHeap::_alloc(&pCVar10->_cbHeap,0x38,&sStack_a0);
      (node->super_CBNode)._prev = (CBNode *)0x0;
      (node->super_CBNode)._next = (CBNode *)0x0;
      (node->super_CBNode)._type = '\x04';
      (node->super_CBNode)._opCount = '\0';
      (node->super_CBNode)._flags = (uint16_t)pCVar10->_nodeFlags;
      (node->super_CBNode)._position = pCVar10->_position;
      (node->super_CBNode)._inlineComment = (char *)0x0;
      (node->super_CBNode)._passData = (void *)0x0;
      node->_id = 0xffffffff;
      node->_numRefs = 0;
      node->_from = (CBJump *)0x0;
      EVar3 = registerLabelNode(pCVar10,node);
      if (EVar3 == 0) {
        pCVar12 = (CBNode *)((ulong)node->_id << 0x20 | 4);
        goto LAB_001124f4;
      }
    }
    CodeEmitter::setLastError(&pCVar10->super_CodeEmitter,EVar3,(char *)0x0);
  }
LAB_001124f4:
  (pCVar11->super_CodeEmitter)._vptr_CodeEmitter = (_func_int **)pCVar12;
  *(CBNode **)&(pCVar11->super_CodeEmitter)._codeInfo = (CBNode *)0x0;
  return (CBData *)pCVar11;
}

Assistant:

CBData* CodeBuilder::newDataNode(const void* data, uint32_t size) noexcept {
  if (size > CBData::kInlineBufferSize) {
    void* cloned = _cbDataZone.alloc(size);
    if (!cloned) return nullptr;

    if (data) ::memcpy(cloned, data, size);
    data = cloned;
  }

  return newNodeT<CBData>(const_cast<void*>(data), size);
}